

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

void PredictorSub10_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  char cVar41;
  byte bVar42;
  char cVar43;
  byte bVar44;
  char cVar45;
  byte bVar46;
  char cVar47;
  byte bVar48;
  char cVar49;
  byte bVar50;
  char cVar51;
  byte bVar52;
  char cVar53;
  byte bVar54;
  char cVar55;
  byte bVar56;
  char cVar57;
  byte bVar58;
  char cVar59;
  byte bVar60;
  char cVar61;
  byte bVar62;
  char cVar63;
  byte bVar64;
  char cVar65;
  byte bVar66;
  char cVar67;
  byte bVar68;
  char cVar69;
  byte bVar70;
  char cVar71;
  byte bVar72;
  
  uVar24 = 0;
  if (3 < num_pixels) {
    uVar23 = 0;
    do {
      puVar3 = in + (uVar23 - 1);
      puVar1 = in + uVar23;
      cVar6 = *(char *)((long)puVar1 + 1);
      cVar7 = *(char *)((long)puVar1 + 2);
      cVar8 = *(char *)((long)puVar1 + 3);
      uVar18 = puVar1[1];
      cVar9 = *(char *)((long)puVar1 + 5);
      cVar10 = *(char *)((long)puVar1 + 6);
      cVar11 = *(char *)((long)puVar1 + 7);
      uVar19 = puVar1[2];
      cVar12 = *(char *)((long)puVar1 + 9);
      cVar13 = *(char *)((long)puVar1 + 10);
      cVar14 = *(char *)((long)puVar1 + 0xb);
      uVar20 = puVar1[3];
      cVar15 = *(char *)((long)puVar1 + 0xd);
      cVar16 = *(char *)((long)puVar1 + 0xe);
      cVar17 = *(char *)((long)puVar1 + 0xf);
      puVar4 = upper + (uVar23 - 1);
      puVar2 = upper + uVar23;
      puVar5 = upper + uVar23 + 1;
      cVar41 = pavgb((byte)*puVar2,(byte)*puVar5);
      cVar43 = pavgb(*(byte *)((long)puVar2 + 1),*(byte *)((long)puVar5 + 1));
      cVar45 = pavgb(*(byte *)((long)puVar2 + 2),*(byte *)((long)puVar5 + 2));
      cVar47 = pavgb(*(byte *)((long)puVar2 + 3),*(byte *)((long)puVar5 + 3));
      cVar49 = pavgb((byte)puVar2[1],(byte)puVar5[1]);
      cVar51 = pavgb(*(byte *)((long)puVar2 + 5),*(byte *)((long)puVar5 + 5));
      cVar53 = pavgb(*(byte *)((long)puVar2 + 6),*(byte *)((long)puVar5 + 6));
      cVar55 = pavgb(*(byte *)((long)puVar2 + 7),*(byte *)((long)puVar5 + 7));
      cVar57 = pavgb((byte)puVar2[2],(byte)puVar5[2]);
      cVar59 = pavgb(*(byte *)((long)puVar2 + 9),*(byte *)((long)puVar5 + 9));
      cVar61 = pavgb(*(byte *)((long)puVar2 + 10),*(byte *)((long)puVar5 + 10));
      cVar63 = pavgb(*(byte *)((long)puVar2 + 0xb),*(byte *)((long)puVar5 + 0xb));
      cVar65 = pavgb((byte)puVar2[3],(byte)puVar5[3]);
      cVar67 = pavgb(*(byte *)((long)puVar2 + 0xd),*(byte *)((long)puVar5 + 0xd));
      cVar69 = pavgb(*(byte *)((long)puVar2 + 0xe),*(byte *)((long)puVar5 + 0xe));
      cVar71 = pavgb(*(byte *)((long)puVar2 + 0xf),*(byte *)((long)puVar5 + 0xf));
      bVar42 = cVar41 - (((byte)*puVar5 ^ (byte)*puVar2) & 1);
      bVar44 = cVar43 - ((*(byte *)((long)puVar5 + 1) ^ *(byte *)((long)puVar2 + 1)) & 1);
      bVar46 = cVar45 - ((*(byte *)((long)puVar5 + 2) ^ *(byte *)((long)puVar2 + 2)) & 1);
      bVar48 = cVar47 - ((*(byte *)((long)puVar5 + 3) ^ *(byte *)((long)puVar2 + 3)) & 1);
      bVar50 = cVar49 - (((byte)puVar5[1] ^ (byte)puVar2[1]) & 1);
      bVar52 = cVar51 - ((*(byte *)((long)puVar5 + 5) ^ *(byte *)((long)puVar2 + 5)) & 1);
      bVar54 = cVar53 - ((*(byte *)((long)puVar5 + 6) ^ *(byte *)((long)puVar2 + 6)) & 1);
      bVar56 = cVar55 - ((*(byte *)((long)puVar5 + 7) ^ *(byte *)((long)puVar2 + 7)) & 1);
      bVar58 = cVar57 - (((byte)puVar5[2] ^ (byte)puVar2[2]) & 1);
      bVar60 = cVar59 - ((*(byte *)((long)puVar5 + 9) ^ *(byte *)((long)puVar2 + 9)) & 1);
      bVar62 = cVar61 - ((*(byte *)((long)puVar5 + 10) ^ *(byte *)((long)puVar2 + 10)) & 1);
      bVar64 = cVar63 - ((*(byte *)((long)puVar5 + 0xb) ^ *(byte *)((long)puVar2 + 0xb)) & 1);
      bVar66 = cVar65 - (((byte)puVar5[3] ^ (byte)puVar2[3]) & 1);
      bVar68 = cVar67 - ((*(byte *)((long)puVar5 + 0xd) ^ *(byte *)((long)puVar2 + 0xd)) & 1);
      bVar70 = cVar69 - ((*(byte *)((long)puVar5 + 0xe) ^ *(byte *)((long)puVar2 + 0xe)) & 1);
      bVar72 = cVar71 - ((*(byte *)((long)puVar5 + 0xf) ^ *(byte *)((long)puVar2 + 0xf)) & 1);
      cVar41 = pavgb((byte)*puVar3,(byte)*puVar4);
      cVar43 = pavgb(*(byte *)((long)puVar3 + 1),*(byte *)((long)puVar4 + 1));
      cVar45 = pavgb(*(byte *)((long)puVar3 + 2),*(byte *)((long)puVar4 + 2));
      cVar47 = pavgb(*(byte *)((long)puVar3 + 3),*(byte *)((long)puVar4 + 3));
      cVar49 = pavgb((byte)puVar3[1],(byte)puVar4[1]);
      cVar51 = pavgb(*(byte *)((long)puVar3 + 5),*(byte *)((long)puVar4 + 5));
      cVar53 = pavgb(*(byte *)((long)puVar3 + 6),*(byte *)((long)puVar4 + 6));
      cVar55 = pavgb(*(byte *)((long)puVar3 + 7),*(byte *)((long)puVar4 + 7));
      cVar57 = pavgb((byte)puVar3[2],(byte)puVar4[2]);
      cVar59 = pavgb(*(byte *)((long)puVar3 + 9),*(byte *)((long)puVar4 + 9));
      cVar61 = pavgb(*(byte *)((long)puVar3 + 10),*(byte *)((long)puVar4 + 10));
      cVar63 = pavgb(*(byte *)((long)puVar3 + 0xb),*(byte *)((long)puVar4 + 0xb));
      cVar65 = pavgb((byte)puVar3[3],(byte)puVar4[3]);
      cVar67 = pavgb(*(byte *)((long)puVar3 + 0xd),*(byte *)((long)puVar4 + 0xd));
      cVar69 = pavgb(*(byte *)((long)puVar3 + 0xe),*(byte *)((long)puVar4 + 0xe));
      cVar71 = pavgb(*(byte *)((long)puVar3 + 0xf),*(byte *)((long)puVar4 + 0xf));
      bVar25 = cVar41 - (((byte)*puVar4 ^ (byte)*puVar3) & 1);
      bVar26 = cVar43 - ((*(byte *)((long)puVar4 + 1) ^ *(byte *)((long)puVar3 + 1)) & 1);
      bVar27 = cVar45 - ((*(byte *)((long)puVar4 + 2) ^ *(byte *)((long)puVar3 + 2)) & 1);
      bVar28 = cVar47 - ((*(byte *)((long)puVar4 + 3) ^ *(byte *)((long)puVar3 + 3)) & 1);
      bVar29 = cVar49 - (((byte)puVar4[1] ^ (byte)puVar3[1]) & 1);
      bVar30 = cVar51 - ((*(byte *)((long)puVar4 + 5) ^ *(byte *)((long)puVar3 + 5)) & 1);
      bVar31 = cVar53 - ((*(byte *)((long)puVar4 + 6) ^ *(byte *)((long)puVar3 + 6)) & 1);
      bVar32 = cVar55 - ((*(byte *)((long)puVar4 + 7) ^ *(byte *)((long)puVar3 + 7)) & 1);
      bVar33 = cVar57 - (((byte)puVar4[2] ^ (byte)puVar3[2]) & 1);
      bVar34 = cVar59 - ((*(byte *)((long)puVar4 + 9) ^ *(byte *)((long)puVar3 + 9)) & 1);
      bVar35 = cVar61 - ((*(byte *)((long)puVar4 + 10) ^ *(byte *)((long)puVar3 + 10)) & 1);
      bVar36 = cVar63 - ((*(byte *)((long)puVar4 + 0xb) ^ *(byte *)((long)puVar3 + 0xb)) & 1);
      bVar37 = cVar65 - (((byte)puVar4[3] ^ (byte)puVar3[3]) & 1);
      bVar38 = cVar67 - ((*(byte *)((long)puVar4 + 0xd) ^ *(byte *)((long)puVar3 + 0xd)) & 1);
      bVar39 = cVar69 - ((*(byte *)((long)puVar4 + 0xe) ^ *(byte *)((long)puVar3 + 0xe)) & 1);
      bVar40 = cVar71 - ((*(byte *)((long)puVar4 + 0xf) ^ *(byte *)((long)puVar3 + 0xf)) & 1);
      cVar41 = pavgb(bVar42,bVar25);
      cVar43 = pavgb(bVar44,bVar26);
      cVar45 = pavgb(bVar46,bVar27);
      cVar47 = pavgb(bVar48,bVar28);
      cVar49 = pavgb(bVar50,bVar29);
      cVar51 = pavgb(bVar52,bVar30);
      cVar53 = pavgb(bVar54,bVar31);
      cVar55 = pavgb(bVar56,bVar32);
      cVar57 = pavgb(bVar58,bVar33);
      cVar59 = pavgb(bVar60,bVar34);
      cVar61 = pavgb(bVar62,bVar35);
      cVar63 = pavgb(bVar64,bVar36);
      cVar65 = pavgb(bVar66,bVar37);
      cVar67 = pavgb(bVar68,bVar38);
      cVar69 = pavgb(bVar70,bVar39);
      cVar71 = pavgb(bVar72,bVar40);
      puVar2 = out + uVar23;
      *(byte *)puVar2 = ((bVar25 ^ bVar42) & 1) + ((char)*puVar1 - cVar41);
      *(byte *)((long)puVar2 + 1) = ((bVar26 ^ bVar44) & 1) + (cVar6 - cVar43);
      *(byte *)((long)puVar2 + 2) = ((bVar27 ^ bVar46) & 1) + (cVar7 - cVar45);
      *(byte *)((long)puVar2 + 3) = ((bVar28 ^ bVar48) & 1) + (cVar8 - cVar47);
      *(byte *)(puVar2 + 1) = ((bVar29 ^ bVar50) & 1) + ((char)uVar18 - cVar49);
      *(byte *)((long)puVar2 + 5) = ((bVar30 ^ bVar52) & 1) + (cVar9 - cVar51);
      *(byte *)((long)puVar2 + 6) = ((bVar31 ^ bVar54) & 1) + (cVar10 - cVar53);
      *(byte *)((long)puVar2 + 7) = ((bVar32 ^ bVar56) & 1) + (cVar11 - cVar55);
      *(byte *)(puVar2 + 2) = ((bVar33 ^ bVar58) & 1) + ((char)uVar19 - cVar57);
      *(byte *)((long)puVar2 + 9) = ((bVar34 ^ bVar60) & 1) + (cVar12 - cVar59);
      *(byte *)((long)puVar2 + 10) = ((bVar35 ^ bVar62) & 1) + (cVar13 - cVar61);
      *(byte *)((long)puVar2 + 0xb) = ((bVar36 ^ bVar64) & 1) + (cVar14 - cVar63);
      *(byte *)(puVar2 + 3) = ((bVar37 ^ bVar66) & 1) + ((char)uVar20 - cVar65);
      *(byte *)((long)puVar2 + 0xd) = ((bVar38 ^ bVar68) & 1) + (cVar15 - cVar67);
      *(byte *)((long)puVar2 + 0xe) = ((bVar39 ^ bVar70) & 1) + (cVar16 - cVar69);
      *(byte *)((long)puVar2 + 0xf) = ((bVar40 ^ bVar72) & 1) + (cVar17 - cVar71);
      uVar24 = uVar23 + 4;
      uVar22 = uVar23 + 8;
      uVar23 = uVar24;
    } while (uVar22 <= (uint)num_pixels);
  }
  iVar21 = num_pixels - (int)uVar24;
  if (iVar21 == 0) {
    return;
  }
  uVar24 = uVar24 & 0xffffffff;
  (*VP8LPredictorsSub_C[10])(in + uVar24,upper + uVar24,iVar21,out + uVar24);
  return;
}

Assistant:

static void PredictorSub10_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    __m128i avgTTR, avgLTL, avg, res;
    Average2_m128i(&T, &TR, &avgTTR);
    Average2_m128i(&L, &TL, &avgLTL);
    Average2_m128i(&avgTTR, &avgLTL, &avg);
    res = _mm_sub_epi8(src, avg);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[10](in + i, upper + i, num_pixels - i, out + i);
  }
}